

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int local_10;
  int local_c;
  int i;
  
  local_c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_10);
  switch(local_10) {
  case 1:
    bVar1 = test1();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 2:
    bVar1 = test2();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 3:
    bVar1 = test3();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 4:
    bVar1 = test4();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 5:
    bVar1 = test5();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 6:
    bVar1 = test6();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 7:
    bVar1 = test7();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 8:
    bVar1 = test8();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 9:
    bVar1 = test9();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK ";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    break;
  case 10:
    bVar1 = test10();
    pcVar3 = "WRONG";
    if (bVar1) {
      pcVar3 = "OK";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return local_c;
}

Assistant:

int main() {
  int i;
  std::cin >> i;
  switch(i) {
    case 1: std::cout << (test1() ? "OK" : "WRONG" ) << std::endl; break;
    case 2: std::cout << (test2() ? "OK" : "WRONG" ) << std::endl; break;
    case 3: std::cout << (test3() ? "OK" : "WRONG" ) << std::endl; break;
    case 4: std::cout << (test4() ? "OK" : "WRONG" ) << std::endl; break;
    case 5: std::cout << (test5() ? "OK" : "WRONG" ) << std::endl; break;
    case 6: std::cout << (test6() ? "OK" : "WRONG" ) << std::endl; break;
    case 7: std::cout << (test7() ? "OK" : "WRONG" ) << std::endl; break;
    case 8: std::cout << (test8() ? "OK" : "WRONG" ) << std::endl; break;
    case 9: std::cout << (test9() ? "OK " : "WRONG" ) << std::endl; break;
    case 10: std::cout << (test10() ? "OK" : "WRONG" ) << std::endl; break;
  }
}